

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O2

void __thiscall
glslang::TConstUnionArray::TConstUnionArray
          (TConstUnionArray *this,TConstUnionArray *a,int start,int size)

{
  pointer pTVar1;
  pointer pTVar2;
  TVector<glslang::TConstUnion> *this_00;
  ulong uVar3;
  ulong uVar4;
  
  this->_vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_0089abb8;
  this_00 = (TVector<glslang::TConstUnion> *)
            TVector<glslang::TConstUnion>::operator_new
                      ((TVector<glslang::TConstUnion> *)0x20,(size_t)a);
  TVector<glslang::TConstUnion>::TVector(this_00,(long)size);
  this->unionArray = this_00;
  uVar3 = 0;
  uVar4 = (ulong)(uint)size;
  if (size < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    pTVar1 = (a->unionArray->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->unionArray->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&pTVar2->type + uVar3) =
         *(undefined4 *)((long)&pTVar1[start].type + uVar3);
    *(undefined8 *)((long)&pTVar2->field_0 + uVar3) =
         *(undefined8 *)((long)&pTVar1[start].field_0 + uVar3);
  }
  return;
}

Assistant:

TConstUnionArray(const TConstUnionArray& a, int start, int size)
    {
        unionArray = new TConstUnionVector(size);
        for (int i = 0; i < size; ++i)
            (*unionArray)[i] = a[start + i];
    }